

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
               (CodedInputStream *input,float *value)

{
  bool bVar1;
  uint32_t temp;
  float local_c;
  
  bVar1 = io::CodedInputStream::ReadLittleEndian32(input,(uint32_t *)&local_c);
  if (bVar1) {
    *value = local_c;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<float, WireFormatLite::TYPE_FLOAT>(
    io::CodedInputStream* input, float* value) {
  uint32_t temp;
  if (!input->ReadLittleEndian32(&temp)) return false;
  *value = DecodeFloat(temp);
  return true;
}